

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

bool __thiscall
llvm::yaml::Output::preflightKey
          (Output *this,char *Key,bool Required,bool SameAsDefault,bool *UseDefault,void **param_5)

{
  bool bVar1;
  reference pIVar2;
  StringRef local_40;
  StringRef local_30;
  
  *UseDefault = false;
  if ((!SameAsDefault || Required) || (this->WriteDefaultValues == true)) {
    pIVar2 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                       ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                        &this->StateStack);
    if ((*pIVar2 & ~inSeqOtherElement) == inFlowMapFirstKey) {
      StringRef::StringRef(&local_40,Key);
      flowKey(this,local_40);
    }
    else {
      newLineCheck(this);
      StringRef::StringRef(&local_30,Key);
      paddedKey(this,local_30);
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Output::preflightKey(const char *Key, bool Required, bool SameAsDefault,
                          bool &UseDefault, void *&) {
  UseDefault = false;
  if (Required || !SameAsDefault || WriteDefaultValues) {
    auto State = StateStack.back();
    if (State == inFlowMapFirstKey || State == inFlowMapOtherKey) {
      flowKey(Key);
    } else {
      newLineCheck();
      paddedKey(Key);
    }
    return true;
  }
  return false;
}